

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O2

llb_buildsystem_command_result_t
anon_unknown.dwarf_868a::depinfo_tester_command_execute_command
          (void *context,llb_buildsystem_command_t *command,llb_buildsystem_interface_t *bi,
          llb_task_interface_t ti,llb_buildsystem_queue_job_context_t *job)

{
  char *ptr_00;
  char *pcVar1;
  llb_buildsystem_command_result_t lVar2;
  allocator local_1d1;
  string indirectInputPath;
  string depInfoPath;
  string outputPath;
  char *ptr;
  string indirectContents;
  string directInputPath;
  string depInfoContents;
  string local_108;
  string local_e8;
  string local_c8 [32];
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  ptr_00 = llb_buildsystem_command_get_description(command);
  ptr = ptr_00;
  llbuild::basic::sys::strsep(&ptr,"|");
  pcVar1 = llbuild::basic::sys::strsep(&ptr,"|");
  std::__cxx11::string::string((string *)&directInputPath,pcVar1,(allocator *)&outputPath);
  puts(directInputPath._M_dataplus._M_p);
  pcVar1 = llbuild::basic::sys::strsep(&ptr,"|");
  std::__cxx11::string::string((string *)&outputPath,pcVar1,(allocator *)&depInfoPath);
  puts(outputPath._M_dataplus._M_p);
  pcVar1 = llbuild::basic::sys::strsep(&ptr,"|");
  std::__cxx11::string::string((string *)&depInfoPath,pcVar1,(allocator *)&indirectInputPath);
  puts(depInfoPath._M_dataplus._M_p);
  std::__cxx11::string::string((string *)&local_48,(string *)&directInputPath);
  readFileContents(&indirectInputPath,&local_48);
  std::__cxx11::string::_M_dispose();
  if (indirectInputPath._M_string_length == 0) {
    lVar2 = llb_buildsystem_command_result_failed;
  }
  else {
    std::__cxx11::string::string((string *)&local_68,(string *)&indirectInputPath);
    readFileContents(&indirectContents,&local_68);
    std::__cxx11::string::_M_dispose();
    if (indirectContents._M_string_length != 0) {
      std::__cxx11::string::string((string *)&local_88,(string *)&outputPath);
      std::__cxx11::string::string((string *)&local_a8,(string *)&indirectContents);
      writeFileContents(&local_88,&local_a8);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      depInfoContents._M_dataplus._M_p = (pointer)&depInfoContents.field_2;
      depInfoContents._M_string_length = 0;
      depInfoContents.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::append((char *)&depInfoContents,0x1b94c2);
      std::__cxx11::string::string(local_c8,"version",&local_1d1);
      std::__cxx11::string::append((string *)&depInfoContents);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::append((char *)&depInfoContents,0x1b94c2);
      std::__cxx11::string::append((char *)&depInfoContents);
      std::__cxx11::string::append((string *)&depInfoContents);
      std::__cxx11::string::append((char *)&depInfoContents,0x1b94c2);
      std::__cxx11::string::append((char *)&depInfoContents);
      std::__cxx11::string::append((string *)&depInfoContents);
      std::__cxx11::string::append((char *)&depInfoContents,0x1b94c2);
      std::__cxx11::string::string((string *)&local_e8,(string *)&depInfoPath);
      std::__cxx11::string::string((string *)&local_108,(string *)&depInfoContents);
      writeFileContents(&local_e8,&local_108);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      llb_free(ptr_00);
      std::__cxx11::string::_M_dispose();
    }
    lVar2 = (llb_buildsystem_command_result_t)(indirectContents._M_string_length == 0);
    std::__cxx11::string::_M_dispose();
  }
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return lVar2;
}

Assistant:

static llb_buildsystem_command_result_t
depinfo_tester_command_execute_command(void *context,
                                       llb_buildsystem_command_t* command,
                                       llb_buildsystem_interface_t* bi,
                                       llb_task_interface_t ti,
                                       llb_buildsystem_queue_job_context_t* job) {
  // The tester tool is given a direct input file whose only contents are the
  // path of another, indirect input file.  It is also given the paths to which
  // it should emit the output file and an ld-style dependency-info file.  It
  // copies the indirect input file to the output file, and creates the depinfo
  // file, recording the direct and indirect input files as input dependencies.
  
  // Because the llb_buildsystem_* API doesn't seem to currently give us access
  // to the command inputs and outputs, and because extending it to do so would
  // be beyond the scope of the change being tested here, we encode the paths of
  // the input, output, and dep-info files in the command the description, which
  // we can access using llb_buildsystem_* calls.
  
  // So we get the description, which is all we have access to, and rely on the
  // use of the pipe character as a record separator in the unit test manifest.
  // llb_buildsystem_command_get_description() function is documented to return
  // a mutable copy that we then have to free, so we're free to modify it.
  char * desc = llb_buildsystem_command_get_description(command);
  char * ptr = desc;
  llbuild::basic::sys::strsep(&ptr, "|"); // skip over rule name
  std::string directInputPath = llbuild::basic::sys::strsep(&ptr, "|");
  puts(directInputPath.c_str());
  std::string outputPath = llbuild::basic::sys::strsep(&ptr, "|");
  puts(outputPath.c_str());
  std::string depInfoPath = llbuild::basic::sys::strsep(&ptr, "|");
  puts(depInfoPath.c_str());
  
  // Read the absolute path of the indirect input from the direct input.
  std::string indirectInputPath = readFileContents(directInputPath);
  if (indirectInputPath.empty()) {
    return llb_buildsystem_command_result_failed;
  }
  
  // Read the contents of the indirect input.
  std::string indirectContents = readFileContents(indirectInputPath);
  if (indirectContents.empty()) {
    return llb_buildsystem_command_result_failed;
  }
  
  // Write the contents of the indirect input to the output.
  writeFileContents(outputPath, indirectContents);
  
  // Write out the ld-style dependency info file, which consists of a sequence
  // of records.  Each record consists of a type byte followed by a C string
  // (i.e. null-terminated).  Type zero is an information string about the tool
  // that produced the dep-info file (commonly containing its name and version)
  // and type 0x10 is plain input file.
  std::string depInfoContents;
  depInfoContents.append("\0", 1);
  depInfoContents.append(std::string("version"));
  depInfoContents.append("\0", 1);
  depInfoContents.append("\020");
  depInfoContents.append(directInputPath);
  depInfoContents.append("\0", 1);
  depInfoContents.append("\020");
  depInfoContents.append(indirectInputPath);
  depInfoContents.append("\0", 1);
  writeFileContents(depInfoPath, depInfoContents);

  // Clean up.
  llb_free(desc);
  return llb_buildsystem_command_result_succeeded;
}